

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * makeTempDir_abi_cxx11_(void)

{
  time_t tVar1;
  ostream *poVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  string *in_RDI;
  Rand48 rand48;
  ushort local_36;
  undefined2 local_34;
  ushort local_32;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  tVar1 = time((time_t *)0x0);
  uVar4 = tVar1 * 0xa5a573a5 ^ 0x5a5a5a5a;
  local_36 = (ushort)uVar4;
  local_34 = (undefined2)(uVar4 >> 0x10);
  local_32 = local_36;
  do {
    std::__cxx11::string::_M_replace((ulong)in_RDI,0,(char *)in_RDI->_M_string_length,0x1b62ed);
    iVar5 = 8;
    do {
      Imath_3_2::nrand48(&local_36);
      std::__cxx11::string::push_back((char)in_RDI);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tempDir = ",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(in_RDI->_M_dataplus)._M_p,in_RDI->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    iVar5 = mkdir((in_RDI->_M_dataplus)._M_p,0x1ff);
    if (iVar5 == 0) {
      std::__cxx11::string::append((char *)in_RDI);
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 != 0x11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR -- mkdir(",0xf);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(in_RDI->_M_dataplus)._M_p,
                            in_RDI->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") failed: errno = ",0x12);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
  } while (iVar5 != 0);
  return in_RDI;
}

Assistant:

string
makeTempDir ()
{
    string tempDir;

    IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*) 0));
    while (true)
    {
#ifdef _WIN32
        char  tmpbuf[4096];
        DWORD len = GetTempPathA (4096, tmpbuf);
        if (len == 0 || len > 4095)
        {
            cerr << "Cannot retrieve temporary directory" << endl;
            exit (1);
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "OpenEXRTest_";
#else
        tempDir = IMF_TMP_DIR "OpenEXRTest_";
#endif
        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti () % 26);

        std::cout << "tempDir = " << tempDir << std::endl;

        int status = mkdir (tempDir.c_str (), 0777);

        if (status == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;
            break; // success
        }

        if (errno != EEXIST)
        {
            std::cerr << "ERROR -- mkdir(" << tempDir
                      << ") failed: "
                         "errno = "
                      << errno << std::endl;
            exit (1);
        }
    }

    return tempDir;
}